

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitRefEq(FunctionValidator *this,RefEq *curr)

{
  uintptr_t in_RAX;
  Type local_28;
  Type eqref;
  
  local_28.id = in_RAX;
  wasm::Type::Type(&local_28,(HeapType)0x3,Nullable);
  shouldBeTrue<wasm::RefEq*>
            (this,(bool)((byte)((((this->
                                  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                  .
                                  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                 .currModule)->features).features >> 10) & 1),curr,
             "ref.eq requires gc [--enable-gc]");
  shouldBeSubType(this,(Type)(curr->left->type).id,local_28,curr->left,
                  "ref.eq\'s left argument should be a subtype of eqref");
  shouldBeSubType(this,(Type)(curr->right->type).id,local_28,curr->right,
                  "ref.eq\'s right argument should be a subtype of eqref");
  return;
}

Assistant:

void FunctionValidator::visitRefEq(RefEq* curr) {
  Type eqref = Type(HeapType::eq, Nullable);
  shouldBeTrue(
    getModule()->features.hasGC(), curr, "ref.eq requires gc [--enable-gc]");
  shouldBeSubType(curr->left->type,
                  eqref,
                  curr->left,
                  "ref.eq's left argument should be a subtype of eqref");
  shouldBeSubType(curr->right->type,
                  eqref,
                  curr->right,
                  "ref.eq's right argument should be a subtype of eqref");
}